

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  bool bVar2;
  pointer ppcVar3;
  mapped_type *this_00;
  cmLocalGenerator *localGen;
  string name;
  cmStateSnapshot snp;
  string snpProjName;
  cmLocalGenerator *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cmStateSnapshot local_88;
  cmStateSnapshot local_68;
  string local_50;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&(this->ProjectMap)._M_t);
  ppcVar1 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1) {
    local_b0 = *ppcVar3;
    cmLocalGenerator::GetStateSnapshot(&local_88,local_b0);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    do {
      cmStateSnapshot::GetProjectName_abi_cxx11_(&local_50,&local_88);
      bVar2 = std::operator!=(&local_a8,&local_50);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&local_a8);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                  ::operator[](&this->ProjectMap,&local_a8);
        std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
                  (this_00,&local_b0);
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent(&local_68,&local_88);
      local_88.Position.Position = local_68.Position.Position;
      local_88.State = local_68.State;
      local_88.Position.Tree = local_68.Position.Tree;
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = cmStateSnapshot::IsValid(&local_88);
    } while (bVar2);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    // for each local generator add all projects
    cmStateSnapshot snp = localGen->GetStateSnapshot();
    std::string name;
    do {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName) {
        name = snpProjName;
        this->ProjectMap[name].push_back(localGen);
      }
      snp = snp.GetBuildsystemDirectoryParent();
    } while (snp.IsValid());
  }
}